

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O3

void decodeQuantum(uchar *dest,char *src)

{
  char cVar1;
  uchar uVar2;
  long lVar3;
  long lVar4;
  char cVar5;
  ulong uVar6;
  
  uVar6 = 0;
  lVar3 = 0;
  do {
    cVar1 = *src;
    cVar5 = 'A';
    lVar4 = 0;
    do {
      if (cVar5 == cVar1) goto LAB_0010452f;
      cVar5 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[lVar4 + 1];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x40);
    lVar4 = 0x40;
    if (cVar5 == cVar1) {
LAB_0010452f:
      uVar6 = uVar6 * 0x40 + lVar4;
    }
    else if (cVar1 == '=') {
      uVar6 = uVar6 << 6;
    }
    lVar3 = lVar3 + 1;
    src = src + 1;
    if (lVar3 == 4) {
      uVar2 = curlx_ultouc(uVar6 & 0xff);
      dest[2] = uVar2;
      uVar2 = curlx_ultouc((ulong)((uint)(uVar6 >> 8) & 0xff));
      dest[1] = uVar2;
      uVar2 = curlx_ultouc((ulong)((uint)uVar6 >> 0x10 & 0xff));
      *dest = uVar2;
      return;
    }
  } while( true );
}

Assistant:

static void decodeQuantum(unsigned char *dest, const char *src)
{
  const char *s, *p;
  unsigned long i, v, x = 0;

  for(i = 0, s = src; i < 4; i++, s++) {
    v = 0;
    p = table64;
    while(*p && (*p != *s)) {
      v++;
      p++;
    }
    if(*p == *s)
      x = (x << 6) + v;
    else if(*s == '=')
      x = (x << 6);
  }

  dest[2] = curlx_ultouc(x & 0xFFUL);
  x >>= 8;
  dest[1] = curlx_ultouc(x & 0xFFUL);
  x >>= 8;
  dest[0] = curlx_ultouc(x & 0xFFUL);
}